

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O3

UBool icu_63::UnicodeSet::resemblesPropertyPattern(UnicodeString *pattern,int32_t pos)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  char16_t *pcVar4;
  
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar2 = *(uint *)((long)&pattern->fUnion + 4);
  }
  else {
    uVar2 = (int)sVar1 >> 5;
  }
  if (uVar2 <= (uint)pos || (int)uVar2 < pos + 5) {
    return '\0';
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar4 = (pattern->fUnion).fFields.fArray;
  }
  else {
    pcVar4 = (char16_t *)((long)&pattern->fUnion + 2);
  }
  if (pcVar4[pos] == L'\\') {
    uVar3 = pos + 1;
    if ((uVar2 <= uVar3) || ((pcVar4[(int)uVar3] & 0xffdfU) != 0x50)) {
      if (uVar2 <= uVar3) {
        return '\0';
      }
      return pcVar4[(int)uVar3] == L'N';
    }
  }
  else {
    if (pcVar4[pos] != L'[') {
      return '\0';
    }
    if (uVar2 <= pos + 1U) {
      return '\0';
    }
    if (pcVar4[(int)(pos + 1U)] != L':') {
      return '\0';
    }
  }
  return '\x01';
}

Assistant:

UBool UnicodeSet::resemblesPropertyPattern(const UnicodeString& pattern,
                                           int32_t pos) {
    // Patterns are at least 5 characters long
    if ((pos+5) > pattern.length()) {
        return FALSE;
    }

    // Look for an opening [:, [:^, \p, or \P
    return isPOSIXOpen(pattern, pos) || isPerlOpen(pattern, pos) || isNameOpen(pattern, pos);
}